

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O2

double __thiscall icu_63::CalendarAstronomer::lstToUT(CalendarAstronomer *this,double lst)

{
  double dVar1;
  double dVar2;
  
  dVar1 = getSiderealOffset(this);
  dVar1 = normalize((lst - dVar1) * 0.9972695663,24.0);
  dVar2 = uprv_floor_63((this->fTime + this->fGmtOffset) / 86400000.0);
  return (dVar2 * 86400000.0 - this->fGmtOffset) + (double)(long)(dVar1 * 3600000.0);
}

Assistant:

double CalendarAstronomer::lstToUT(double lst) {
    // Convert to local mean time
    double lt = normalize((lst - getSiderealOffset()) * 0.9972695663, 24);

    // Then find local midnight on this day
    double base = (DAY_MS * ClockMath::floorDivide(fTime + fGmtOffset,(double)DAY_MS)) - fGmtOffset;

    //out("    lt  =" + lt + " hours");
    //out("    base=" + new Date(base));

    return base + (long)(lt * HOUR_MS);
}